

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wiener_convolve_sse2.c
# Opt level: O0

void av1_wiener_convolve_add_src_sse2
               (uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,ptrdiff_t dst_stride,
               int16_t *filter_x,int x_step_q4,int16_t *filter_y,int y_step_q4,int w,int h,
               WienerConvolveParams *conv_params)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  short sVar35;
  int iVar36;
  long lVar37;
  undefined1 (*pauVar38) [16];
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  __m128i res_lo;
  __m128i res_odd_1;
  __m128i res_7_1;
  __m128i res_5_1;
  __m128i res_3_1;
  __m128i res_1_1;
  __m128i src_7_1;
  __m128i src_5_1;
  __m128i src_3_1;
  __m128i src_1_1;
  __m128i res_even_1;
  __m128i res_6_1;
  __m128i res_4_1;
  __m128i res_2_1;
  __m128i res_0_1;
  __m128i src_6_1;
  __m128i src_4_1;
  __m128i src_2_1;
  __m128i src_0_1;
  uint16_t *data_1;
  __m128i round_const_1;
  __m128i coeff_67_1;
  __m128i coeff_45_1;
  __m128i coeff_23_1;
  __m128i coeff_01_1;
  __m128i tmp_1_1;
  __m128i tmp_0_1;
  __m128i coeffs_y;
  __m128i res;
  __m128i res_odd;
  __m128i res_7;
  __m128i src_7;
  __m128i res_5;
  __m128i src_5;
  __m128i res_3;
  __m128i src_3;
  __m128i res_1;
  __m128i src_1;
  __m128i res_even;
  __m128i res_6;
  __m128i src_6;
  __m128i res_4;
  __m128i src_4;
  __m128i res_2;
  __m128i src_2;
  __m128i res_0;
  __m128i src_0;
  __m128i data;
  __m128i round_const;
  __m128i coeff_67;
  __m128i coeff_45;
  __m128i coeff_23;
  __m128i coeff_01;
  __m128i tmp_1;
  __m128i tmp_0;
  __m128i coeffs_x;
  __m128i offset;
  __m128i zero;
  uint8_t *src_ptr;
  int center_tap;
  int j;
  int i;
  int intermediate_height;
  uint16_t temp [17280];
  int bd;
  undefined8 local_93b8;
  undefined8 local_93a8;
  undefined8 local_9398;
  undefined8 local_9388;
  undefined8 local_9348;
  undefined8 uStack_9340;
  undefined8 local_91f8;
  undefined8 local_91e8;
  undefined8 local_91d8;
  undefined8 local_91c8;
  int local_9154;
  int local_9150;
  undefined8 local_9148 [32];
  undefined8 auStack_9048 [32];
  undefined8 auStack_8f48 [32];
  undefined8 auStack_8e48 [32];
  undefined8 auStack_8d48 [32];
  undefined8 auStack_8c48 [32];
  undefined8 auStack_8b48 [32];
  undefined8 auStack_8a48 [4106];
  short sStack_9f2;
  short sStack_9d2;
  undefined4 uStack_984;
  undefined4 uStack_964;
  undefined4 uStack_91c;
  undefined4 uStack_8fc;
  undefined4 uStack_860;
  undefined4 uStack_850;
  undefined4 uStack_840;
  undefined4 uStack_830;
  undefined4 uStack_820;
  undefined4 uStack_810;
  undefined4 uStack_800;
  undefined4 uStack_7f0;
  byte local_7c8;
  undefined1 uStack_7c7;
  undefined1 uStack_7c6;
  undefined1 uStack_7c5;
  byte bStack_7c4;
  undefined1 uStack_7c3;
  undefined1 uStack_7c2;
  undefined1 uStack_7c1;
  byte local_7a8;
  undefined1 uStack_7a7;
  undefined1 uStack_7a6;
  undefined1 uStack_7a5;
  byte bStack_7a4;
  undefined1 uStack_7a3;
  undefined1 uStack_7a2;
  undefined1 uStack_7a1;
  byte local_788;
  undefined1 uStack_787;
  undefined1 uStack_786;
  undefined1 uStack_785;
  byte bStack_784;
  undefined1 uStack_783;
  undefined1 uStack_782;
  undefined1 uStack_781;
  byte local_768;
  undefined1 uStack_767;
  undefined1 uStack_766;
  undefined1 uStack_765;
  byte bStack_764;
  undefined1 uStack_763;
  undefined1 uStack_762;
  undefined1 uStack_761;
  byte local_748;
  undefined1 uStack_747;
  undefined1 uStack_746;
  undefined1 uStack_745;
  byte bStack_744;
  undefined1 uStack_743;
  undefined1 uStack_742;
  undefined1 uStack_741;
  byte local_728;
  undefined1 uStack_727;
  undefined1 uStack_726;
  undefined1 uStack_725;
  byte bStack_724;
  undefined1 uStack_723;
  undefined1 uStack_722;
  undefined1 uStack_721;
  byte local_708;
  undefined1 uStack_707;
  undefined1 uStack_706;
  undefined1 uStack_705;
  byte bStack_704;
  undefined1 uStack_703;
  undefined1 uStack_702;
  undefined1 uStack_701;
  byte local_6e8;
  undefined1 uStack_6e7;
  undefined1 uStack_6e6;
  undefined1 uStack_6e5;
  byte bStack_6e4;
  undefined1 uStack_6e3;
  undefined1 uStack_6e2;
  undefined1 uStack_6e1;
  int iStack_4ac;
  int local_478;
  int iStack_474;
  int iStack_470;
  int iStack_46c;
  int local_468;
  int iStack_464;
  int iStack_460;
  int iStack_45c;
  int local_458;
  int iStack_454;
  int iStack_450;
  int iStack_44c;
  int local_448;
  int iStack_444;
  int iStack_440;
  int iStack_43c;
  int local_418;
  int iStack_414;
  int iStack_410;
  int iStack_40c;
  int local_408;
  int iStack_404;
  int iStack_400;
  int iStack_3fc;
  int local_3f8;
  int iStack_3f4;
  int iStack_3f0;
  int iStack_3ec;
  int local_3e8;
  int iStack_3e4;
  int iStack_3e0;
  int iStack_3dc;
  int local_398;
  int iStack_394;
  int iStack_390;
  int iStack_38c;
  int local_388;
  int iStack_384;
  int iStack_380;
  int iStack_37c;
  int local_378;
  int iStack_374;
  int iStack_370;
  int iStack_36c;
  int local_368;
  int iStack_364;
  int iStack_360;
  int iStack_35c;
  int iStack_34c;
  int local_318;
  int iStack_314;
  int iStack_310;
  int iStack_30c;
  int local_308;
  int iStack_304;
  int iStack_300;
  int iStack_2fc;
  int local_2f8;
  int iStack_2f4;
  int iStack_2f0;
  int iStack_2ec;
  int local_2e8;
  int iStack_2e4;
  int iStack_2e0;
  int iStack_2dc;
  short local_1e8;
  short sStack_1e6;
  short sStack_1e4;
  short sStack_1e2;
  short sStack_1e0;
  short sStack_1de;
  short sStack_1dc;
  short sStack_1da;
  undefined2 local_1a8;
  undefined2 uStack_1a6;
  undefined2 uStack_1a4;
  undefined2 uStack_1a2;
  undefined2 local_198;
  undefined2 uStack_196;
  undefined2 uStack_194;
  undefined2 uStack_192;
  undefined2 local_188;
  undefined2 uStack_186;
  undefined2 uStack_184;
  undefined2 uStack_182;
  undefined2 local_178;
  undefined2 uStack_176;
  undefined2 uStack_174;
  undefined2 uStack_172;
  undefined2 local_168;
  undefined2 uStack_166;
  undefined2 uStack_164;
  undefined2 uStack_162;
  undefined2 local_158;
  undefined2 uStack_156;
  undefined2 uStack_154;
  undefined2 uStack_152;
  undefined2 local_148;
  undefined2 uStack_146;
  undefined2 uStack_144;
  undefined2 uStack_142;
  undefined2 local_138;
  undefined2 uStack_136;
  undefined2 uStack_134;
  undefined2 uStack_132;
  undefined2 uStack_120;
  undefined2 uStack_11e;
  undefined2 uStack_11c;
  undefined2 uStack_11a;
  undefined2 uStack_110;
  undefined2 uStack_10e;
  undefined2 uStack_10c;
  undefined2 uStack_10a;
  undefined2 uStack_100;
  undefined2 uStack_fe;
  undefined2 uStack_fc;
  undefined2 uStack_fa;
  undefined2 uStack_f0;
  undefined2 uStack_ee;
  undefined2 uStack_ec;
  undefined2 uStack_ea;
  undefined2 uStack_e0;
  undefined2 uStack_de;
  undefined2 uStack_dc;
  undefined2 uStack_da;
  undefined2 uStack_d0;
  undefined2 uStack_ce;
  undefined2 uStack_cc;
  undefined2 uStack_ca;
  undefined2 uStack_c0;
  undefined2 uStack_be;
  undefined2 uStack_bc;
  undefined2 uStack_ba;
  undefined2 uStack_b0;
  undefined2 uStack_ae;
  undefined2 uStack_ac;
  undefined2 uStack_aa;
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  short sStack_90;
  short sStack_8e;
  short sStack_8c;
  short sStack_8a;
  __m128i *p;
  __m128i res_8bit;
  __m128i res_16bit;
  __m128i res_hi_round;
  __m128i res_lo_round;
  __m128i res_hi;
  
  lVar37 = (long)(((int)res_7_1[0] + 6) * 0x80);
  *(undefined8 *)((long)local_9148 + lVar37 * 2 + 0x70) = 0;
  *(undefined8 *)((long)local_9148 + lVar37 * 2 + 0x78) = 0;
  *(undefined8 *)((long)local_9148 + lVar37 * 2 + 0x60) = 0;
  *(undefined8 *)((long)local_9148 + lVar37 * 2 + 0x68) = 0;
  *(undefined8 *)((long)local_9148 + lVar37 * 2 + 0x50) = 0;
  *(undefined8 *)((long)local_9148 + lVar37 * 2 + 0x58) = 0;
  *(undefined8 *)((long)local_9148 + lVar37 * 2 + 0x40) = 0;
  *(undefined8 *)((long)local_9148 + lVar37 * 2 + 0x48) = 0;
  *(undefined8 *)((long)local_9148 + lVar37 * 2 + 0x30) = 0;
  *(undefined8 *)((long)local_9148 + lVar37 * 2 + 0x38) = 0;
  *(undefined8 *)((long)local_9148 + lVar37 * 2 + 0x20) = 0;
  *(undefined8 *)((long)local_9148 + lVar37 * 2 + 0x28) = 0;
  *(undefined8 *)((long)local_9148 + lVar37 * 2 + 0x10) = 0;
  *(undefined8 *)((long)local_9148 + lVar37 * 2 + 0x18) = 0;
  *(undefined8 *)((long)local_9148 + lVar37 * 2) = 0;
  *(undefined8 *)((long)local_9148 + lVar37 * 2 + 8) = 0;
  uVar1 = *in_R8;
  sStack_9d2 = (short)((ulong)uVar1 >> 0x30);
  uStack_964 = (undefined4)(CONCAT26(sStack_9d2 + 0x80,(int6)uVar1) >> 0x20);
  uVar5 = (undefined4)in_R8[1];
  uStack_8fc = (undefined4)((ulong)in_R8[1] >> 0x20);
  uVar4 = CONCAT44((int)uVar1,(int)uVar1);
  local_91c8 = CONCAT44(uStack_964,uStack_800);
  uVar1 = CONCAT44(uVar5,uVar5);
  local_91e8 = CONCAT44(uStack_8fc,uStack_820);
  iVar36 = (1 << (*(char *)res_7_1[1] - 1U & 0x1f)) + 0x4000;
  res_8bit[0]._4_2_ = (undefined2)iVar36;
  res_8bit[0]._6_2_ = (undefined2)((uint)iVar36 >> 0x10);
  for (local_9150 = 0; local_9150 < (int)res_7_1[0] + 6; local_9150 = local_9150 + 1) {
    for (local_9154 = 0; local_9154 < (int)res_odd_1[1]; local_9154 = local_9154 + 8) {
      pauVar38 = (undefined1 (*) [16])
                 (in_RDI + -3 + in_RSI * -3 + local_9150 * in_RSI + (long)local_9154);
      uVar2 = *(undefined8 *)*pauVar38;
      auVar44 = *pauVar38;
      auVar6 = *pauVar38;
      auVar45 = *pauVar38;
      auVar43 = *pauVar38;
      auVar42 = *pauVar38;
      auVar41 = *pauVar38;
      auVar40 = *pauVar38;
      local_6e8 = (byte)uVar2;
      uStack_6e7 = (undefined1)((ulong)uVar2 >> 8);
      uStack_6e6 = (undefined1)((ulong)uVar2 >> 0x10);
      uStack_6e5 = (undefined1)((ulong)uVar2 >> 0x18);
      bStack_6e4 = (byte)((ulong)uVar2 >> 0x20);
      uStack_6e3 = (undefined1)((ulong)uVar2 >> 0x28);
      uStack_6e2 = (undefined1)((ulong)uVar2 >> 0x30);
      uStack_6e1 = (undefined1)((ulong)uVar2 >> 0x38);
      auVar30[1] = 0;
      auVar30[0] = local_6e8;
      auVar30[2] = uStack_6e7;
      auVar30[3] = 0;
      auVar30[4] = uStack_6e6;
      auVar30[5] = 0;
      auVar30[6] = uStack_6e5;
      auVar30[7] = 0;
      auVar30[9] = 0;
      auVar30[8] = bStack_6e4;
      auVar30[10] = uStack_6e3;
      auVar30[0xb] = 0;
      auVar30[0xc] = uStack_6e2;
      auVar30[0xd] = 0;
      auVar30[0xe] = uStack_6e1;
      auVar30[0xf] = 0;
      auVar29._8_8_ = uVar4;
      auVar29._0_8_ = local_91c8;
      auVar39 = pmaddwd(auVar30,auVar29);
      local_708 = auVar40[2];
      uStack_707 = auVar40[3];
      uStack_706 = auVar40[4];
      uStack_705 = auVar40[5];
      bStack_704 = auVar40[6];
      uStack_703 = auVar40[7];
      uStack_702 = auVar40[8];
      uStack_701 = auVar40[9];
      auVar28[1] = 0;
      auVar28[0] = local_708;
      auVar28[2] = uStack_707;
      auVar28[3] = 0;
      auVar28[4] = uStack_706;
      auVar28[5] = 0;
      auVar28[6] = uStack_705;
      auVar28[7] = 0;
      auVar28[9] = 0;
      auVar28[8] = bStack_704;
      auVar28[10] = uStack_703;
      auVar28[0xb] = 0;
      auVar28[0xc] = uStack_702;
      auVar28[0xd] = 0;
      auVar28[0xe] = uStack_701;
      auVar27._12_4_ = uStack_964;
      auVar27._8_4_ = uStack_7f0;
      auVar28[0xf] = 0;
      auVar27._0_8_ = local_91d8;
      auVar40 = pmaddwd(auVar28,auVar27);
      local_728 = auVar41[4];
      uStack_727 = auVar41[5];
      uStack_726 = auVar41[6];
      uStack_725 = auVar41[7];
      bStack_724 = auVar41[8];
      uStack_723 = auVar41[9];
      uStack_722 = auVar41[10];
      uStack_721 = auVar41[0xb];
      auVar26[1] = 0;
      auVar26[0] = local_728;
      auVar26[2] = uStack_727;
      auVar26[3] = 0;
      auVar26[4] = uStack_726;
      auVar26[5] = 0;
      auVar26[6] = uStack_725;
      auVar26[7] = 0;
      auVar26[9] = 0;
      auVar26[8] = bStack_724;
      auVar26[10] = uStack_723;
      auVar26[0xb] = 0;
      auVar26[0xc] = uStack_722;
      auVar26[0xd] = 0;
      auVar26[0xe] = uStack_721;
      auVar26[0xf] = 0;
      auVar25._8_8_ = uVar1;
      auVar25._0_8_ = local_91e8;
      auVar41 = pmaddwd(auVar26,auVar25);
      local_748 = auVar42[6];
      uStack_747 = auVar42[7];
      uStack_746 = auVar42[8];
      uStack_745 = auVar42[9];
      bStack_744 = auVar42[10];
      uStack_743 = auVar42[0xb];
      uStack_742 = auVar42[0xc];
      uStack_741 = auVar42[0xd];
      auVar24[1] = 0;
      auVar24[0] = local_748;
      auVar24[2] = uStack_747;
      auVar24[3] = 0;
      auVar24[4] = uStack_746;
      auVar24[5] = 0;
      auVar24[6] = uStack_745;
      auVar24[7] = 0;
      auVar24[9] = 0;
      auVar24[8] = bStack_744;
      auVar24[10] = uStack_743;
      auVar24[0xb] = 0;
      auVar24[0xc] = uStack_742;
      auVar24[0xd] = 0;
      auVar24[0xe] = uStack_741;
      auVar23._12_4_ = uStack_8fc;
      auVar23._8_4_ = uStack_810;
      auVar24[0xf] = 0;
      auVar23._0_8_ = local_91f8;
      auVar42 = pmaddwd(auVar24,auVar23);
      local_2e8 = auVar39._0_4_;
      iStack_2e4 = auVar39._4_4_;
      iStack_2e0 = auVar39._8_4_;
      iStack_2dc = auVar39._12_4_;
      local_2f8 = auVar41._0_4_;
      iStack_2f4 = auVar41._4_4_;
      iStack_2f0 = auVar41._8_4_;
      iStack_2ec = auVar41._12_4_;
      local_308 = auVar40._0_4_;
      iStack_304 = auVar40._4_4_;
      iStack_300 = auVar40._8_4_;
      iStack_2fc = auVar40._12_4_;
      local_318 = auVar42._0_4_;
      iStack_314 = auVar42._4_4_;
      iStack_310 = auVar42._8_4_;
      iStack_30c = auVar42._12_4_;
      iStack_34c = (int)(CONCAT26(res_8bit[0]._6_2_,CONCAT24(res_8bit[0]._4_2_,iVar36)) >> 0x20);
      auVar39 = ZEXT416(*(uint *)res_7_1[1]);
      local_768 = auVar43[1];
      uStack_767 = auVar43[2];
      uStack_766 = auVar43[3];
      uStack_765 = auVar43[4];
      bStack_764 = auVar43[5];
      uStack_763 = auVar43[6];
      uStack_762 = auVar43[7];
      uStack_761 = auVar43[8];
      auVar22[1] = 0;
      auVar22[0] = local_768;
      auVar22[2] = uStack_767;
      auVar22[3] = 0;
      auVar22[4] = uStack_766;
      auVar22[5] = 0;
      auVar22[6] = uStack_765;
      auVar22[7] = 0;
      auVar22[9] = 0;
      auVar22[8] = bStack_764;
      auVar22[10] = uStack_763;
      auVar22[0xb] = 0;
      auVar22[0xc] = uStack_762;
      auVar22[0xd] = 0;
      auVar22[0xe] = uStack_761;
      auVar22[0xf] = 0;
      auVar21._8_8_ = uVar4;
      auVar21._0_8_ = local_91c8;
      auVar40 = pmaddwd(auVar22,auVar21);
      local_788 = auVar45[3];
      uStack_787 = auVar45[4];
      uStack_786 = auVar45[5];
      uStack_785 = auVar45[6];
      bStack_784 = auVar45[7];
      uStack_783 = auVar45[8];
      uStack_782 = auVar45[9];
      uStack_781 = auVar45[10];
      auVar20[1] = 0;
      auVar20[0] = local_788;
      auVar20[2] = uStack_787;
      auVar20[3] = 0;
      auVar20[4] = uStack_786;
      auVar20[5] = 0;
      auVar20[6] = uStack_785;
      auVar20[7] = 0;
      auVar20[9] = 0;
      auVar20[8] = bStack_784;
      auVar20[10] = uStack_783;
      auVar20[0xb] = 0;
      auVar20[0xc] = uStack_782;
      auVar20[0xd] = 0;
      auVar20[0xe] = uStack_781;
      auVar19._12_4_ = uStack_964;
      auVar19._8_4_ = uStack_7f0;
      auVar20[0xf] = 0;
      auVar19._0_8_ = local_91d8;
      auVar41 = pmaddwd(auVar20,auVar19);
      local_7a8 = auVar6[5];
      uStack_7a7 = auVar6[6];
      uStack_7a6 = auVar6[7];
      uStack_7a5 = auVar6[8];
      bStack_7a4 = auVar6[9];
      uStack_7a3 = auVar6[10];
      uStack_7a2 = auVar6[0xb];
      uStack_7a1 = auVar6[0xc];
      auVar18[1] = 0;
      auVar18[0] = local_7a8;
      auVar18[2] = uStack_7a7;
      auVar18[3] = 0;
      auVar18[4] = uStack_7a6;
      auVar18[5] = 0;
      auVar18[6] = uStack_7a5;
      auVar18[7] = 0;
      auVar18[9] = 0;
      auVar18[8] = bStack_7a4;
      auVar18[10] = uStack_7a3;
      auVar18[0xb] = 0;
      auVar18[0xc] = uStack_7a2;
      auVar18[0xd] = 0;
      auVar18[0xe] = uStack_7a1;
      auVar18[0xf] = 0;
      auVar17._8_8_ = uVar1;
      auVar17._0_8_ = local_91e8;
      auVar42 = pmaddwd(auVar18,auVar17);
      local_7c8 = auVar44[7];
      uStack_7c7 = auVar44[8];
      uStack_7c6 = auVar44[9];
      uStack_7c5 = auVar44[10];
      bStack_7c4 = auVar44[0xb];
      uStack_7c3 = auVar44[0xc];
      uStack_7c2 = auVar44[0xd];
      uStack_7c1 = auVar44[0xe];
      auVar16[1] = 0;
      auVar16[0] = local_7c8;
      auVar16[2] = uStack_7c7;
      auVar16[3] = 0;
      auVar16[4] = uStack_7c6;
      auVar16[5] = 0;
      auVar16[6] = uStack_7c5;
      auVar16[7] = 0;
      auVar16[9] = 0;
      auVar16[8] = bStack_7c4;
      auVar16[10] = uStack_7c3;
      auVar16[0xb] = 0;
      auVar16[0xc] = uStack_7c2;
      auVar16[0xd] = 0;
      auVar16[0xe] = uStack_7c1;
      auVar15._12_4_ = uStack_8fc;
      auVar15._8_4_ = uStack_810;
      auVar16[0xf] = 0;
      auVar15._0_8_ = local_91f8;
      auVar43 = pmaddwd(auVar16,auVar15);
      local_368 = auVar40._0_4_;
      iStack_364 = auVar40._4_4_;
      iStack_360 = auVar40._8_4_;
      iStack_35c = auVar40._12_4_;
      local_378 = auVar42._0_4_;
      iStack_374 = auVar42._4_4_;
      iStack_370 = auVar42._8_4_;
      iStack_36c = auVar42._12_4_;
      local_388 = auVar41._0_4_;
      iStack_384 = auVar41._4_4_;
      iStack_380 = auVar41._8_4_;
      iStack_37c = auVar41._12_4_;
      local_398 = auVar43._0_4_;
      iStack_394 = auVar43._4_4_;
      iStack_390 = auVar43._8_4_;
      iStack_38c = auVar43._12_4_;
      auVar40 = ZEXT416(*(uint *)res_7_1[1]);
      auVar34._4_4_ = iStack_2e4 + iStack_2f4 + iStack_304 + iStack_314 + iVar36 >> auVar39;
      auVar34._0_4_ = local_2e8 + local_2f8 + local_308 + local_318 + iVar36 >> auVar39;
      auVar34._12_4_ = iStack_2dc + iStack_2ec + iStack_2fc + iStack_30c + iStack_34c >> auVar39;
      auVar34._8_4_ = iStack_2e0 + iStack_2f0 + iStack_300 + iStack_310 + iVar36 >> auVar39;
      auVar33._4_4_ = iStack_364 + iStack_374 + iStack_384 + iStack_394 + iVar36 >> auVar40;
      auVar33._0_4_ = local_368 + local_378 + local_388 + local_398 + iVar36 >> auVar40;
      auVar33._12_4_ = iStack_35c + iStack_36c + iStack_37c + iStack_38c + iStack_34c >> auVar40;
      auVar33._8_4_ = iStack_360 + iStack_370 + iStack_380 + iStack_390 + iVar36 >> auVar40;
      auVar40 = packssdw(auVar34,auVar33);
      local_1e8 = auVar40._0_2_;
      sStack_1e6 = auVar40._2_2_;
      sStack_1e4 = auVar40._4_2_;
      sStack_1e2 = auVar40._6_2_;
      sStack_1e0 = auVar40._8_2_;
      sStack_1de = auVar40._10_2_;
      sStack_1dc = auVar40._12_2_;
      sStack_1da = auVar40._14_2_;
      local_1e8 = (ushort)(-1 < local_1e8) * local_1e8;
      sStack_1e6 = (ushort)(-1 < sStack_1e6) * sStack_1e6;
      sStack_1e4 = (ushort)(-1 < sStack_1e4) * sStack_1e4;
      sStack_1e2 = (ushort)(-1 < sStack_1e2) * sStack_1e2;
      sStack_1e0 = (ushort)(-1 < sStack_1e0) * sStack_1e0;
      sStack_1de = (ushort)(-1 < sStack_1de) * sStack_1de;
      sStack_1dc = (ushort)(-1 < sStack_1dc) * sStack_1dc;
      sStack_1da = (ushort)(-1 < sStack_1da) * sStack_1da;
      sVar35 = (short)(1 << (0x10U - *(char *)res_7_1[1] & 0x1f)) + -1;
      local_9348._0_4_ =
           CONCAT22((ushort)(sVar35 < sStack_1e6) * sVar35 |
                    (ushort)(sVar35 >= sStack_1e6) * sStack_1e6,
                    (ushort)(sVar35 < local_1e8) * sVar35 |
                    (ushort)(sVar35 >= local_1e8) * local_1e8);
      local_9348._0_6_ =
           CONCAT24((ushort)(sVar35 < sStack_1e4) * sVar35 |
                    (ushort)(sVar35 >= sStack_1e4) * sStack_1e4,(undefined4)local_9348);
      local_9348 = CONCAT26((ushort)(sVar35 < sStack_1e2) * sVar35 |
                            (ushort)(sVar35 >= sStack_1e2) * sStack_1e2,(undefined6)local_9348);
      uStack_9340._0_2_ =
           (ushort)(sVar35 < sStack_1e0) * sVar35 | (ushort)(sVar35 >= sStack_1e0) * sStack_1e0;
      uStack_9340._2_2_ =
           (ushort)(sVar35 < sStack_1de) * sVar35 | (ushort)(sVar35 >= sStack_1de) * sStack_1de;
      uStack_9340._4_2_ =
           (ushort)(sVar35 < sStack_1dc) * sVar35 | (ushort)(sVar35 >= sStack_1dc) * sStack_1dc;
      uStack_9340._6_2_ =
           (ushort)(sVar35 < sStack_1da) * sVar35 | (ushort)(sVar35 >= sStack_1da) * sStack_1da;
      lVar37 = (long)(local_9150 * 0x80 + local_9154) * 2;
      *(undefined8 *)((long)local_9148 + lVar37) = local_9348;
      *(undefined8 *)((long)local_9148 + lVar37 + 8) = uStack_9340;
    }
  }
  uVar1 = *(undefined8 *)res_lo[1];
  sStack_9f2 = (short)((ulong)uVar1 >> 0x30);
  uStack_984 = (undefined4)(CONCAT26(sStack_9f2 + 0x80,(int6)uVar1) >> 0x20);
  uVar5 = (undefined4)*(undefined8 *)(res_lo[1] + 8);
  uStack_91c = (undefined4)((ulong)*(undefined8 *)(res_lo[1] + 8) >> 0x20);
  uVar4 = CONCAT44((int)uVar1,(int)uVar1);
  local_9388 = CONCAT44(uStack_984,uStack_840);
  uVar1 = CONCAT44(uVar5,uVar5);
  local_93a8 = CONCAT44(uStack_91c,uStack_860);
  iVar36 = (1 << (*(char *)(res_7_1[1] + 4) - 1U & 0x1f)) -
           (1 << (*(char *)(res_7_1[1] + 4) + 7U & 0x1f));
  res_hi_round[0]._4_2_ = (undefined2)iVar36;
  res_hi_round[0]._6_2_ = (undefined2)((uint)iVar36 >> 0x10);
  for (local_9150 = 0; local_9150 < (int)res_7_1[0]; local_9150 = local_9150 + 1) {
    for (local_9154 = 0; local_9154 < (int)res_odd_1[1]; local_9154 = local_9154 + 8) {
      lVar37 = (long)(local_9150 * 0x80 + local_9154) * 2;
      uVar2 = *(undefined8 *)((long)local_9148 + lVar37);
      uVar3 = *(undefined8 *)((long)auStack_9048 + lVar37);
      local_138 = (undefined2)uVar2;
      uStack_136 = (undefined2)((ulong)uVar2 >> 0x10);
      uStack_134 = (undefined2)((ulong)uVar2 >> 0x20);
      uStack_132 = (undefined2)((ulong)uVar2 >> 0x30);
      local_148 = (undefined2)uVar3;
      uStack_146 = (undefined2)((ulong)uVar3 >> 0x10);
      uStack_144 = (undefined2)((ulong)uVar3 >> 0x20);
      uStack_142 = (undefined2)((ulong)uVar3 >> 0x30);
      uVar2 = *(undefined8 *)((long)auStack_8f48 + lVar37);
      uVar3 = *(undefined8 *)((long)auStack_8e48 + lVar37);
      local_158 = (undefined2)uVar2;
      uStack_156 = (undefined2)((ulong)uVar2 >> 0x10);
      uStack_154 = (undefined2)((ulong)uVar2 >> 0x20);
      uStack_152 = (undefined2)((ulong)uVar2 >> 0x30);
      local_168 = (undefined2)uVar3;
      uStack_166 = (undefined2)((ulong)uVar3 >> 0x10);
      uStack_164 = (undefined2)((ulong)uVar3 >> 0x20);
      uStack_162 = (undefined2)((ulong)uVar3 >> 0x30);
      uVar2 = *(undefined8 *)((long)auStack_8d48 + lVar37);
      uVar3 = *(undefined8 *)((long)auStack_8c48 + lVar37);
      local_178 = (undefined2)uVar2;
      uStack_176 = (undefined2)((ulong)uVar2 >> 0x10);
      uStack_174 = (undefined2)((ulong)uVar2 >> 0x20);
      uStack_172 = (undefined2)((ulong)uVar2 >> 0x30);
      local_188 = (undefined2)uVar3;
      uStack_186 = (undefined2)((ulong)uVar3 >> 0x10);
      uStack_184 = (undefined2)((ulong)uVar3 >> 0x20);
      uStack_182 = (undefined2)((ulong)uVar3 >> 0x30);
      uVar2 = *(undefined8 *)((long)auStack_8b48 + lVar37);
      uVar3 = *(undefined8 *)((long)auStack_8a48 + lVar37);
      local_198 = (undefined2)uVar2;
      uStack_196 = (undefined2)((ulong)uVar2 >> 0x10);
      uStack_194 = (undefined2)((ulong)uVar2 >> 0x20);
      uStack_192 = (undefined2)((ulong)uVar2 >> 0x30);
      local_1a8 = (undefined2)uVar3;
      uStack_1a6 = (undefined2)((ulong)uVar3 >> 0x10);
      uStack_1a4 = (undefined2)((ulong)uVar3 >> 0x20);
      uStack_1a2 = (undefined2)((ulong)uVar3 >> 0x30);
      auVar14._2_2_ = local_148;
      auVar14._0_2_ = local_138;
      auVar14._4_2_ = uStack_136;
      auVar14._6_2_ = uStack_146;
      auVar14._10_2_ = uStack_144;
      auVar14._8_2_ = uStack_134;
      auVar14._12_2_ = uStack_132;
      auVar14._14_2_ = uStack_142;
      auVar13._8_8_ = uVar4;
      auVar13._0_8_ = local_9388;
      auVar40 = pmaddwd(auVar14,auVar13);
      auVar12._2_2_ = local_168;
      auVar12._0_2_ = local_158;
      auVar12._4_2_ = uStack_156;
      auVar12._6_2_ = uStack_166;
      auVar12._10_2_ = uStack_164;
      auVar12._8_2_ = uStack_154;
      auVar12._12_2_ = uStack_152;
      auVar12._14_2_ = uStack_162;
      auVar11._12_4_ = uStack_984;
      auVar11._8_4_ = uStack_830;
      auVar11._0_8_ = local_9398;
      auVar41 = pmaddwd(auVar12,auVar11);
      auVar10._2_2_ = local_188;
      auVar10._0_2_ = local_178;
      auVar10._4_2_ = uStack_176;
      auVar10._6_2_ = uStack_186;
      auVar10._10_2_ = uStack_184;
      auVar10._8_2_ = uStack_174;
      auVar10._12_2_ = uStack_172;
      auVar10._14_2_ = uStack_182;
      auVar9._8_8_ = uVar1;
      auVar9._0_8_ = local_93a8;
      auVar42 = pmaddwd(auVar10,auVar9);
      auVar8._2_2_ = local_1a8;
      auVar8._0_2_ = local_198;
      auVar8._4_2_ = uStack_196;
      auVar8._6_2_ = uStack_1a6;
      auVar8._10_2_ = uStack_1a4;
      auVar8._8_2_ = uStack_194;
      auVar8._12_2_ = uStack_192;
      auVar8._14_2_ = uStack_1a2;
      auVar7._12_4_ = uStack_91c;
      auVar7._8_4_ = uStack_850;
      auVar7._0_8_ = local_93b8;
      auVar43 = pmaddwd(auVar8,auVar7);
      local_3e8 = auVar40._0_4_;
      iStack_3e4 = auVar40._4_4_;
      iStack_3e0 = auVar40._8_4_;
      iStack_3dc = auVar40._12_4_;
      local_3f8 = auVar41._0_4_;
      iStack_3f4 = auVar41._4_4_;
      iStack_3f0 = auVar41._8_4_;
      iStack_3ec = auVar41._12_4_;
      local_408 = auVar42._0_4_;
      iStack_404 = auVar42._4_4_;
      iStack_400 = auVar42._8_4_;
      iStack_3fc = auVar42._12_4_;
      local_418 = auVar43._0_4_;
      iStack_414 = auVar43._4_4_;
      iStack_410 = auVar43._8_4_;
      iStack_40c = auVar43._12_4_;
      uVar2 = *(undefined8 *)((long)local_9148 + lVar37 + 8);
      uVar3 = *(undefined8 *)((long)auStack_9048 + lVar37 + 8);
      uStack_b0 = (undefined2)uVar2;
      uStack_ae = (undefined2)((ulong)uVar2 >> 0x10);
      uStack_ac = (undefined2)((ulong)uVar2 >> 0x20);
      uStack_aa = (undefined2)((ulong)uVar2 >> 0x30);
      uStack_c0 = (undefined2)uVar3;
      uStack_be = (undefined2)((ulong)uVar3 >> 0x10);
      uStack_bc = (undefined2)((ulong)uVar3 >> 0x20);
      uStack_ba = (undefined2)((ulong)uVar3 >> 0x30);
      uVar2 = *(undefined8 *)((long)auStack_8f48 + lVar37 + 8);
      uVar3 = *(undefined8 *)((long)auStack_8e48 + lVar37 + 8);
      uStack_d0 = (undefined2)uVar2;
      uStack_ce = (undefined2)((ulong)uVar2 >> 0x10);
      uStack_cc = (undefined2)((ulong)uVar2 >> 0x20);
      uStack_ca = (undefined2)((ulong)uVar2 >> 0x30);
      uStack_e0 = (undefined2)uVar3;
      uStack_de = (undefined2)((ulong)uVar3 >> 0x10);
      uStack_dc = (undefined2)((ulong)uVar3 >> 0x20);
      uStack_da = (undefined2)((ulong)uVar3 >> 0x30);
      uVar2 = *(undefined8 *)((long)auStack_8d48 + lVar37 + 8);
      uVar3 = *(undefined8 *)((long)auStack_8c48 + lVar37 + 8);
      uStack_f0 = (undefined2)uVar2;
      uStack_ee = (undefined2)((ulong)uVar2 >> 0x10);
      uStack_ec = (undefined2)((ulong)uVar2 >> 0x20);
      uStack_ea = (undefined2)((ulong)uVar2 >> 0x30);
      uStack_100 = (undefined2)uVar3;
      uStack_fe = (undefined2)((ulong)uVar3 >> 0x10);
      uStack_fc = (undefined2)((ulong)uVar3 >> 0x20);
      uStack_fa = (undefined2)((ulong)uVar3 >> 0x30);
      uVar2 = *(undefined8 *)((long)auStack_8b48 + lVar37 + 8);
      uVar3 = *(undefined8 *)((long)auStack_8a48 + lVar37 + 8);
      uStack_110 = (undefined2)uVar2;
      uStack_10e = (undefined2)((ulong)uVar2 >> 0x10);
      uStack_10c = (undefined2)((ulong)uVar2 >> 0x20);
      uStack_10a = (undefined2)((ulong)uVar2 >> 0x30);
      uStack_120 = (undefined2)uVar3;
      uStack_11e = (undefined2)((ulong)uVar3 >> 0x10);
      uStack_11c = (undefined2)((ulong)uVar3 >> 0x20);
      uStack_11a = (undefined2)((ulong)uVar3 >> 0x30);
      auVar39._2_2_ = uStack_c0;
      auVar39._0_2_ = uStack_b0;
      auVar39._4_2_ = uStack_ae;
      auVar39._6_2_ = uStack_be;
      auVar39._10_2_ = uStack_bc;
      auVar39._8_2_ = uStack_ac;
      auVar39._12_2_ = uStack_aa;
      auVar39._14_2_ = uStack_ba;
      auVar44._8_8_ = uVar4;
      auVar44._0_8_ = local_9388;
      auVar44 = pmaddwd(auVar39,auVar44);
      auVar6._2_2_ = uStack_e0;
      auVar6._0_2_ = uStack_d0;
      auVar6._4_2_ = uStack_ce;
      auVar6._6_2_ = uStack_de;
      auVar6._10_2_ = uStack_dc;
      auVar6._8_2_ = uStack_cc;
      auVar6._12_2_ = uStack_ca;
      auVar6._14_2_ = uStack_da;
      auVar45._12_4_ = uStack_984;
      auVar45._8_4_ = uStack_830;
      auVar45._0_8_ = local_9398;
      auVar45 = pmaddwd(auVar6,auVar45);
      auVar43._2_2_ = uStack_100;
      auVar43._0_2_ = uStack_f0;
      auVar43._4_2_ = uStack_ee;
      auVar43._6_2_ = uStack_fe;
      auVar43._10_2_ = uStack_fc;
      auVar43._8_2_ = uStack_ec;
      auVar43._12_2_ = uStack_ea;
      auVar43._14_2_ = uStack_fa;
      auVar42._8_8_ = uVar1;
      auVar42._0_8_ = local_93a8;
      auVar42 = pmaddwd(auVar43,auVar42);
      auVar41._2_2_ = uStack_120;
      auVar41._0_2_ = uStack_110;
      auVar41._4_2_ = uStack_10e;
      auVar41._6_2_ = uStack_11e;
      auVar41._10_2_ = uStack_11c;
      auVar41._8_2_ = uStack_10c;
      auVar41._12_2_ = uStack_10a;
      auVar41._14_2_ = uStack_11a;
      auVar40._12_4_ = uStack_91c;
      auVar40._8_4_ = uStack_850;
      auVar40._0_8_ = local_93b8;
      auVar40 = pmaddwd(auVar41,auVar40);
      local_448 = auVar44._0_4_;
      iStack_444 = auVar44._4_4_;
      iStack_440 = auVar44._8_4_;
      iStack_43c = auVar44._12_4_;
      local_458 = auVar45._0_4_;
      iStack_454 = auVar45._4_4_;
      iStack_450 = auVar45._8_4_;
      iStack_44c = auVar45._12_4_;
      local_468 = auVar42._0_4_;
      iStack_464 = auVar42._4_4_;
      iStack_460 = auVar42._8_4_;
      iStack_45c = auVar42._12_4_;
      local_478 = auVar40._0_4_;
      iStack_474 = auVar40._4_4_;
      iStack_470 = auVar40._8_4_;
      iStack_46c = auVar40._12_4_;
      iStack_4ac = (int)(CONCAT26(res_hi_round[0]._6_2_,CONCAT24(res_hi_round[0]._4_2_,iVar36)) >>
                        0x20);
      auVar40 = ZEXT416(*(uint *)(res_7_1[1] + 4));
      auVar41 = ZEXT416(*(uint *)(res_7_1[1] + 4));
      auVar32._4_4_ = local_448 + local_458 + local_468 + local_478 + iVar36 >> auVar40;
      auVar32._0_4_ = local_3e8 + local_3f8 + local_408 + local_418 + iVar36 >> auVar40;
      auVar32._12_4_ = iStack_444 + iStack_454 + iStack_464 + iStack_474 + iStack_4ac >> auVar40;
      auVar32._8_4_ = iStack_3e4 + iStack_3f4 + iStack_404 + iStack_414 + iVar36 >> auVar40;
      auVar31._4_4_ = iStack_440 + iStack_450 + iStack_460 + iStack_470 + iVar36 >> auVar41;
      auVar31._0_4_ = iStack_3e0 + iStack_3f0 + iStack_400 + iStack_410 + iVar36 >> auVar41;
      auVar31._12_4_ = iStack_43c + iStack_44c + iStack_45c + iStack_46c + iStack_4ac >> auVar41;
      auVar31._8_4_ = iStack_3dc + iStack_3ec + iStack_3fc + iStack_40c + iVar36 >> auVar41;
      auVar40 = packssdw(auVar32,auVar31);
      local_98 = auVar40._0_2_;
      sStack_96 = auVar40._2_2_;
      sStack_94 = auVar40._4_2_;
      sStack_92 = auVar40._6_2_;
      sStack_90 = auVar40._8_2_;
      sStack_8e = auVar40._10_2_;
      sStack_8c = auVar40._12_2_;
      sStack_8a = auVar40._14_2_;
      *(ulong *)(in_RDX + local_9150 * in_RCX + (long)local_9154) =
           CONCAT17((0 < sStack_8a) * (sStack_8a < 0x100) * auVar40[0xe] - (0xff < sStack_8a),
                    CONCAT16((0 < sStack_8c) * (sStack_8c < 0x100) * auVar40[0xc] -
                             (0xff < sStack_8c),
                             CONCAT15((0 < sStack_8e) * (sStack_8e < 0x100) * auVar40[10] -
                                      (0xff < sStack_8e),
                                      CONCAT14((0 < sStack_90) * (sStack_90 < 0x100) * auVar40[8] -
                                               (0xff < sStack_90),
                                               CONCAT13((0 < sStack_92) * (sStack_92 < 0x100) *
                                                        auVar40[6] - (0xff < sStack_92),
                                                        CONCAT12((0 < sStack_94) *
                                                                 (sStack_94 < 0x100) * auVar40[4] -
                                                                 (0xff < sStack_94),
                                                                 CONCAT11((0 < sStack_96) *
                                                                          (sStack_96 < 0x100) *
                                                                          auVar40[2] -
                                                                          (0xff < sStack_96),
                                                                          (0 < local_98) *
                                                                          (local_98 < 0x100) *
                                                                          auVar40[0] -
                                                                          (0xff < local_98))))))));
    }
  }
  return;
}

Assistant:

void av1_wiener_convolve_add_src_sse2(const uint8_t *src, ptrdiff_t src_stride,
                                      uint8_t *dst, ptrdiff_t dst_stride,
                                      const int16_t *filter_x, int x_step_q4,
                                      const int16_t *filter_y, int y_step_q4,
                                      int w, int h,
                                      const WienerConvolveParams *conv_params) {
  const int bd = 8;
  assert(x_step_q4 == 16 && y_step_q4 == 16);
  assert(!(w & 7));
  (void)x_step_q4;
  (void)y_step_q4;

  DECLARE_ALIGNED(16, uint16_t,
                  temp[(MAX_SB_SIZE + SUBPEL_TAPS - 1) * MAX_SB_SIZE]);
  int intermediate_height = h + SUBPEL_TAPS - 2;
  memset(temp + (intermediate_height * MAX_SB_SIZE), 0, MAX_SB_SIZE);
  int i, j;
  const int center_tap = ((SUBPEL_TAPS - 1) / 2);
  const uint8_t *const src_ptr = src - center_tap * src_stride - center_tap;

  const __m128i zero = _mm_setzero_si128();
  // Add an offset to account for the "add_src" part of the convolve function.
  const __m128i offset = _mm_insert_epi16(zero, 1 << FILTER_BITS, 3);

  /* Horizontal filter */
  {
    const __m128i coeffs_x =
        _mm_add_epi16(_mm_loadu_si128((__m128i *)filter_x), offset);

    // coeffs 0 1 0 1 2 3 2 3
    const __m128i tmp_0 = _mm_unpacklo_epi32(coeffs_x, coeffs_x);
    // coeffs 4 5 4 5 6 7 6 7
    const __m128i tmp_1 = _mm_unpackhi_epi32(coeffs_x, coeffs_x);

    // coeffs 0 1 0 1 0 1 0 1
    const __m128i coeff_01 = _mm_unpacklo_epi64(tmp_0, tmp_0);
    // coeffs 2 3 2 3 2 3 2 3
    const __m128i coeff_23 = _mm_unpackhi_epi64(tmp_0, tmp_0);
    // coeffs 4 5 4 5 4 5 4 5
    const __m128i coeff_45 = _mm_unpacklo_epi64(tmp_1, tmp_1);
    // coeffs 6 7 6 7 6 7 6 7
    const __m128i coeff_67 = _mm_unpackhi_epi64(tmp_1, tmp_1);

    const __m128i round_const = _mm_set1_epi32(
        (1 << (conv_params->round_0 - 1)) + (1 << (bd + FILTER_BITS - 1)));

    for (i = 0; i < intermediate_height; ++i) {
      for (j = 0; j < w; j += 8) {
        const __m128i data =
            _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j]);

        // Filter even-index pixels
        const __m128i src_0 = _mm_unpacklo_epi8(data, zero);
        const __m128i res_0 = _mm_madd_epi16(src_0, coeff_01);
        const __m128i src_2 = _mm_unpacklo_epi8(_mm_srli_si128(data, 2), zero);
        const __m128i res_2 = _mm_madd_epi16(src_2, coeff_23);
        const __m128i src_4 = _mm_unpacklo_epi8(_mm_srli_si128(data, 4), zero);
        const __m128i res_4 = _mm_madd_epi16(src_4, coeff_45);
        const __m128i src_6 = _mm_unpacklo_epi8(_mm_srli_si128(data, 6), zero);
        const __m128i res_6 = _mm_madd_epi16(src_6, coeff_67);

        __m128i res_even = _mm_add_epi32(_mm_add_epi32(res_0, res_4),
                                         _mm_add_epi32(res_2, res_6));
        res_even = _mm_srai_epi32(_mm_add_epi32(res_even, round_const),
                                  conv_params->round_0);

        // Filter odd-index pixels
        const __m128i src_1 = _mm_unpacklo_epi8(_mm_srli_si128(data, 1), zero);
        const __m128i res_1 = _mm_madd_epi16(src_1, coeff_01);
        const __m128i src_3 = _mm_unpacklo_epi8(_mm_srli_si128(data, 3), zero);
        const __m128i res_3 = _mm_madd_epi16(src_3, coeff_23);
        const __m128i src_5 = _mm_unpacklo_epi8(_mm_srli_si128(data, 5), zero);
        const __m128i res_5 = _mm_madd_epi16(src_5, coeff_45);
        const __m128i src_7 = _mm_unpacklo_epi8(_mm_srli_si128(data, 7), zero);
        const __m128i res_7 = _mm_madd_epi16(src_7, coeff_67);

        __m128i res_odd = _mm_add_epi32(_mm_add_epi32(res_1, res_5),
                                        _mm_add_epi32(res_3, res_7));
        res_odd = _mm_srai_epi32(_mm_add_epi32(res_odd, round_const),
                                 conv_params->round_0);

        // Pack in the column order 0, 2, 4, 6, 1, 3, 5, 7
        __m128i res = _mm_packs_epi32(res_even, res_odd);
        res = _mm_min_epi16(
            _mm_max_epi16(res, zero),
            _mm_set1_epi16(WIENER_CLAMP_LIMIT(conv_params->round_0, bd) - 1));
        _mm_storeu_si128((__m128i *)&temp[i * MAX_SB_SIZE + j], res);
      }
    }
  }

  /* Vertical filter */
  {
    const __m128i coeffs_y =
        _mm_add_epi16(_mm_loadu_si128((__m128i *)filter_y), offset);

    // coeffs 0 1 0 1 2 3 2 3
    const __m128i tmp_0 = _mm_unpacklo_epi32(coeffs_y, coeffs_y);
    // coeffs 4 5 4 5 6 7 6 7
    const __m128i tmp_1 = _mm_unpackhi_epi32(coeffs_y, coeffs_y);

    // coeffs 0 1 0 1 0 1 0 1
    const __m128i coeff_01 = _mm_unpacklo_epi64(tmp_0, tmp_0);
    // coeffs 2 3 2 3 2 3 2 3
    const __m128i coeff_23 = _mm_unpackhi_epi64(tmp_0, tmp_0);
    // coeffs 4 5 4 5 4 5 4 5
    const __m128i coeff_45 = _mm_unpacklo_epi64(tmp_1, tmp_1);
    // coeffs 6 7 6 7 6 7 6 7
    const __m128i coeff_67 = _mm_unpackhi_epi64(tmp_1, tmp_1);

    const __m128i round_const =
        _mm_set1_epi32((1 << (conv_params->round_1 - 1)) -
                       (1 << (bd + conv_params->round_1 - 1)));

    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; j += 8) {
        // Filter even-index pixels
        const uint16_t *data = &temp[i * MAX_SB_SIZE + j];
        const __m128i src_0 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 0 * MAX_SB_SIZE),
                               *(__m128i *)(data + 1 * MAX_SB_SIZE));
        const __m128i src_2 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 2 * MAX_SB_SIZE),
                               *(__m128i *)(data + 3 * MAX_SB_SIZE));
        const __m128i src_4 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 4 * MAX_SB_SIZE),
                               *(__m128i *)(data + 5 * MAX_SB_SIZE));
        const __m128i src_6 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 6 * MAX_SB_SIZE),
                               *(__m128i *)(data + 7 * MAX_SB_SIZE));

        const __m128i res_0 = _mm_madd_epi16(src_0, coeff_01);
        const __m128i res_2 = _mm_madd_epi16(src_2, coeff_23);
        const __m128i res_4 = _mm_madd_epi16(src_4, coeff_45);
        const __m128i res_6 = _mm_madd_epi16(src_6, coeff_67);

        const __m128i res_even = _mm_add_epi32(_mm_add_epi32(res_0, res_2),
                                               _mm_add_epi32(res_4, res_6));

        // Filter odd-index pixels
        const __m128i src_1 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 0 * MAX_SB_SIZE),
                               *(__m128i *)(data + 1 * MAX_SB_SIZE));
        const __m128i src_3 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 2 * MAX_SB_SIZE),
                               *(__m128i *)(data + 3 * MAX_SB_SIZE));
        const __m128i src_5 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 4 * MAX_SB_SIZE),
                               *(__m128i *)(data + 5 * MAX_SB_SIZE));
        const __m128i src_7 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 6 * MAX_SB_SIZE),
                               *(__m128i *)(data + 7 * MAX_SB_SIZE));

        const __m128i res_1 = _mm_madd_epi16(src_1, coeff_01);
        const __m128i res_3 = _mm_madd_epi16(src_3, coeff_23);
        const __m128i res_5 = _mm_madd_epi16(src_5, coeff_45);
        const __m128i res_7 = _mm_madd_epi16(src_7, coeff_67);

        const __m128i res_odd = _mm_add_epi32(_mm_add_epi32(res_1, res_3),
                                              _mm_add_epi32(res_5, res_7));

        // Rearrange pixels back into the order 0 ... 7
        const __m128i res_lo = _mm_unpacklo_epi32(res_even, res_odd);
        const __m128i res_hi = _mm_unpackhi_epi32(res_even, res_odd);

        const __m128i res_lo_round = _mm_srai_epi32(
            _mm_add_epi32(res_lo, round_const), conv_params->round_1);
        const __m128i res_hi_round = _mm_srai_epi32(
            _mm_add_epi32(res_hi, round_const), conv_params->round_1);

        const __m128i res_16bit = _mm_packs_epi32(res_lo_round, res_hi_round);
        __m128i res_8bit = _mm_packus_epi16(res_16bit, res_16bit);

        __m128i *const p = (__m128i *)&dst[i * dst_stride + j];
        _mm_storel_epi64(p, res_8bit);
      }
    }
  }
}